

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int walkExpr(Walker *pWalker,Expr *pExpr)

{
  uint uVar1;
  int iVar2;
  Expr *pEStack_20;
  int rc;
  Expr *pExpr_local;
  Walker *pWalker_local;
  
  pEStack_20 = pExpr;
  while( true ) {
    uVar1 = (*pWalker->xExprCallback)(pWalker,pEStack_20);
    if (uVar1 != 0) {
      return uVar1 & 2;
    }
    if ((pEStack_20->flags & 0x810000) != 0) {
      return 0;
    }
    if ((pEStack_20->pLeft != (Expr *)0x0) &&
       (iVar2 = walkExpr(pWalker,pEStack_20->pLeft), iVar2 != 0)) {
      return 2;
    }
    if (pEStack_20->pRight == (Expr *)0x0) break;
    pEStack_20 = pEStack_20->pRight;
  }
  if ((pEStack_20->flags & 0x1000) != 0) {
    iVar2 = sqlite3WalkSelect(pWalker,(pEStack_20->x).pSelect);
    if (iVar2 == 0) {
      return 0;
    }
    return 2;
  }
  if (((pEStack_20->x).pList != (ExprList *)0x0) &&
     (iVar2 = sqlite3WalkExprList(pWalker,(pEStack_20->x).pList), iVar2 != 0)) {
    return 2;
  }
  if ((pEStack_20->flags & 0x1000000) == 0) {
    return 0;
  }
  iVar2 = walkWindowList(pWalker,(pEStack_20->y).pWin,1);
  if (iVar2 == 0) {
    return 0;
  }
  return 2;
}

Assistant:

static SQLITE_NOINLINE int walkExpr(Walker *pWalker, Expr *pExpr){
  int rc;
  testcase( ExprHasProperty(pExpr, EP_TokenOnly) );
  testcase( ExprHasProperty(pExpr, EP_Reduced) );
  while(1){
    rc = pWalker->xExprCallback(pWalker, pExpr);
    if( rc ) return rc & WRC_Abort;
    if( !ExprHasProperty(pExpr,(EP_TokenOnly|EP_Leaf)) ){
      assert( pExpr->x.pList==0 || pExpr->pRight==0 );
      if( pExpr->pLeft && walkExpr(pWalker, pExpr->pLeft) ) return WRC_Abort;
      if( pExpr->pRight ){
        assert( !ExprHasProperty(pExpr, EP_WinFunc) );
        pExpr = pExpr->pRight;
        continue;
      }else if( ExprUseXSelect(pExpr) ){
        assert( !ExprHasProperty(pExpr, EP_WinFunc) );
        if( sqlite3WalkSelect(pWalker, pExpr->x.pSelect) ) return WRC_Abort;
      }else{
        if( pExpr->x.pList ){
          if( sqlite3WalkExprList(pWalker, pExpr->x.pList) ) return WRC_Abort;
        }
#ifndef SQLITE_OMIT_WINDOWFUNC
        if( ExprHasProperty(pExpr, EP_WinFunc) ){
          if( walkWindowList(pWalker, pExpr->y.pWin, 1) ) return WRC_Abort;
        }
#endif
      }
    }
    break;
  }
  return WRC_Continue;
}